

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

void __thiscall ExecutorRegVm::~ExecutorRegVm(ExecutorRegVm *this)

{
  ExecutorRegVm *this_local;
  
  (*(code *)NULLC::dealloc)(this->execErrorBuffer);
  (*(code *)NULLC::dealloc)(this->tempStackArrayBase);
  (*(code *)NULLC::dealloc)(this->regFileArrayBase);
  FastVector<RegVmCmd,_false,_false>::~FastVector(&this->breakCode);
  FastVector<RegVmCmd_*,_false,_false>::~FastVector(&this->callStack);
  FastVector<char,_true,_true>::~FastVector(&this->dataStack);
  return;
}

Assistant:

ExecutorRegVm::~ExecutorRegVm()
{
	NULLC::dealloc(execErrorBuffer);

	NULLC::dealloc(tempStackArrayBase);

	NULLC::dealloc(regFileArrayBase);

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(dcCallVM)
		dcFree(dcCallVM);
#endif
}